

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gizmo.c
# Opt level: O3

void golf_gizmo_update(golf_gizmo_t *gizmo,ImDrawList *draw_list)

{
  golf_transform_t *pgVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  float fVar11;
  undefined4 uVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  float fVar23;
  undefined4 uVar24;
  float fVar25;
  golf_gizmo_operation gVar26;
  undefined8 uVar27;
  vec2 vVar28;
  ImVec4 col;
  ImVec4 col_00;
  ImVec4 col_01;
  ImVec4 col_02;
  ImVec4 col_03;
  ImVec4 col_04;
  ImVec4 col_05;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  vec3 plane_point;
  vec3 v2;
  vec3 v1;
  vec3 v2_00;
  vec3 v1_00;
  vec3 v2_01;
  vec3 v2_02;
  vec3 v2_03;
  vec3 v2_04;
  vec3 world_pos;
  vec3 v1_01;
  vec3 v2_05;
  vec3 v1_02;
  vec3 v1_03;
  vec3 v1_04;
  vec3 v1_05;
  vec3 v1_06;
  vec3 world_pos_00;
  vec3 world_pos_01;
  vec3 world_pos_02;
  golf_gizmo_t *pgVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  _Bool _Var33;
  uint uVar34;
  ImU32 IVar35;
  golf_inputs_t *pgVar36;
  golf_graphics_t *pgVar37;
  int i;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  vec3 *pvVar42;
  float *pfVar43;
  ulong uVar44;
  int i_2;
  float *pfVar45;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 uVar46;
  undefined4 uVar47;
  vec3 vVar48;
  vec3 v;
  vec3 v1_07;
  vec3 p1;
  vec3 v1_08;
  vec3 v_00;
  vec3 point;
  vec3 ro;
  vec3 v_01;
  vec3 v1_09;
  vec3 v1_10;
  vec3 v1_11;
  vec3 u;
  vec3 world_pos_03;
  vec3 world_pos_04;
  vec3 v1_12;
  vec3 u_00;
  vec3 vec;
  vec3 v_02;
  vec3 v1_13;
  vec3 p1_00;
  vec3 v1_14;
  vec3 position;
  vec3 v1_15;
  vec3 vec_00;
  vec3 vec_01;
  vec3 vec_02;
  vec3 position_00;
  vec3 world_pos_05;
  vec3 v_03;
  vec3 v1_16;
  vec3 position_01;
  vec3 world_pos_06;
  vec3 v_04;
  vec3 v1_17;
  vec3 q1;
  vec3 rd;
  vec3 q1_00;
  vec3 scale;
  vec3 scale_00;
  vec3 scale_01;
  quat qVar49;
  vec4 vVar50;
  vec3 p2;
  vec3 p2_00;
  float s;
  int idx;
  float t;
  float r_angle;
  vec3 c2;
  vec3 closest_point [3];
  vec3 axis [3];
  vec4 color [3];
  vec3 c1;
  mat4 model_mat;
  undefined8 uVar51;
  undefined8 uVar52;
  vec3 local_2f8;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined1 local_2c8 [16];
  float local_2ac;
  undefined1 local_2a8 [8];
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined1 local_298 [8];
  undefined4 uStack_290;
  undefined4 uStack_28c;
  float local_280;
  uint local_27c;
  undefined1 local_278 [16];
  golf_gizmo_t *local_260;
  vec3 local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined8 uStack_220;
  vec3 local_218 [3];
  undefined8 uStack_1f0;
  float afStack_1e8 [12];
  vec3 local_1b8;
  undefined8 local_1ac;
  float local_1a4;
  undefined8 local_1a0;
  float local_198;
  undefined1 local_188 [16];
  quat *local_170;
  vec4 local_168 [3];
  undefined1 local_138 [8];
  vec2 avStack_130 [24];
  mat4 local_70;
  
  if (gizmo->is_on == true) {
    pgVar36 = golf_inputs_get();
    pgVar37 = golf_graphics_get();
    pgVar1 = &gizmo->transform;
    uVar2 = (pgVar1->position).x;
    uVar14 = (pgVar1->position).y;
    local_2c8._4_4_ = uVar14;
    local_2c8._0_4_ = uVar2;
    fVar8 = (gizmo->transform).position.z;
    local_2c8._8_8_ = 0;
    fVar11 = vec3_distance(pgVar37->cam_pos,pgVar1->position);
    local_278._0_4_ = fVar11 * 0.1;
    mat4_from_quat(&local_70,(gizmo->transform).rotation);
    vVar48 = vec3_create(1.0,0.0,0.0);
    m.m[2] = local_70.m[2];
    m.m[3] = local_70.m[3];
    m.m[0] = local_70.m[0];
    m.m[1] = local_70.m[1];
    m.m[4] = local_70.m[4];
    m.m[5] = local_70.m[5];
    m.m[6] = local_70.m[6];
    m.m[7] = local_70.m[7];
    m.m[8] = local_70.m[8];
    m.m[9] = local_70.m[9];
    m.m[10] = local_70.m[10];
    m.m[0xb] = local_70.m[0xb];
    m.m[0xc] = local_70.m[0xc];
    m.m[0xd] = local_70.m[0xd];
    m.m[0xe] = local_70.m[0xe];
    m.m[0xf] = local_70.m[0xf];
    vVar48 = vec3_apply_mat4(vVar48,0.0,m);
    local_1b8.z = vVar48.z;
    local_1b8._0_8_ = vVar48._0_8_;
    vVar48 = vec3_create(0.0,1.0,0.0);
    m_00.m[2] = local_70.m[2];
    m_00.m[3] = local_70.m[3];
    m_00.m[0] = local_70.m[0];
    m_00.m[1] = local_70.m[1];
    m_00.m[4] = local_70.m[4];
    m_00.m[5] = local_70.m[5];
    m_00.m[6] = local_70.m[6];
    m_00.m[7] = local_70.m[7];
    m_00.m[8] = local_70.m[8];
    m_00.m[9] = local_70.m[9];
    m_00.m[10] = local_70.m[10];
    m_00.m[0xb] = local_70.m[0xb];
    m_00.m[0xc] = local_70.m[0xc];
    m_00.m[0xd] = local_70.m[0xd];
    m_00.m[0xe] = local_70.m[0xe];
    m_00.m[0xf] = local_70.m[0xf];
    vVar48 = vec3_apply_mat4(vVar48,0.0,m_00);
    local_1a4 = vVar48.z;
    local_1ac = vVar48._0_8_;
    vVar48 = vec3_create(0.0,0.0,1.0);
    m_01.m[2] = local_70.m[2];
    m_01.m[3] = local_70.m[3];
    m_01.m[0] = local_70.m[0];
    m_01.m[1] = local_70.m[1];
    m_01.m[4] = local_70.m[4];
    m_01.m[5] = local_70.m[5];
    m_01.m[6] = local_70.m[6];
    m_01.m[7] = local_70.m[7];
    m_01.m[8] = local_70.m[8];
    m_01.m[9] = local_70.m[9];
    m_01.m[10] = local_70.m[10];
    m_01.m[0xb] = local_70.m[0xb];
    m_01.m[0xc] = local_70.m[0xc];
    m_01.m[0xd] = local_70.m[0xd];
    m_01.m[0xe] = local_70.m[0xe];
    m_01.m[0xf] = local_70.m[0xf];
    vVar48 = vec3_apply_mat4(vVar48,0.0,m_01);
    local_198 = vVar48.z;
    local_1a0 = vVar48._0_8_;
    local_168[0] = vec4_create(1.0,0.0,0.0,1.0);
    local_168[1] = vec4_create(0.0,1.0,0.0,1.0);
    local_168[2] = vec4_create(0.0,0.0,1.0,1.0);
    auVar30 = local_2c8;
    gVar26 = gizmo->operation;
    if (gVar26 == GOLF_GIZMO_SCALE) {
      fVar11 = 3.4028235e+38;
      uVar44 = 0xffffffff;
      lVar41 = 0;
      uVar39 = 0;
      uVar51 = local_70.m._0_8_;
      uVar52 = local_70.m._8_8_;
      local_260 = gizmo;
      do {
        local_2e8._0_4_ = fVar11;
        pvVar42 = &pgVar36->mouse_ray_orig;
        uVar7 = pvVar42->x;
        uVar19 = pvVar42->y;
        local_2d8._4_4_ = uVar19;
        local_2d8._0_4_ = uVar7;
        _uStack_2d0 = 0;
        local_2a8._0_4_ = (pgVar36->mouse_ray_orig).z;
        vVar48 = vec3_add(*pvVar42,pgVar36->mouse_ray_dir);
        uStack_290 = extraout_XMM0_Dc_10;
        local_298 = (undefined1  [8])vVar48._0_8_;
        uStack_28c = extraout_XMM0_Dd_10;
        local_238._0_4_ = vVar48.z;
        v_02.z = *(float *)((long)&local_1b8.z + lVar41);
        v_02._0_8_ = *(undefined8 *)((long)&local_1b8.x + lVar41);
        vVar48 = vec3_scale(v_02,(float)local_278._0_4_);
        auVar30 = local_2c8;
        v1_13.z = fVar8;
        v1_13.x = (float)local_2c8._0_4_;
        v1_13.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar48 = vec3_add(v1_13,vVar48);
        auVar32 = _local_298;
        auVar31 = local_2c8;
        auVar30 = _local_2d8;
        p1_00.z = (float)local_2a8._0_4_;
        p1_00.x = (float)local_2d8._0_4_;
        p1_00.y = (float)local_2d8._4_4_;
        q1_00.z = (float)local_238._0_4_;
        q1_00.x = (float)local_298._0_4_;
        q1_00.y = (float)local_298._4_4_;
        p2_00.z = fVar8;
        p2_00.x = (float)local_2c8._0_4_;
        p2_00.y = (float)local_2c8._4_4_;
        _local_2d8 = auVar30;
        local_2c8 = auVar31;
        _local_298 = auVar32;
        closest_point_ray_ray
                  (p1_00,q1_00,p2_00,vVar48,&local_2f8.x,&local_258.x,(vec3 *)local_138,local_218);
        world_pos_02.z = avStack_130[0].x;
        world_pos_02.x = (float)local_138._0_4_;
        world_pos_02.y = (float)local_138._4_4_;
        vVar28 = golf_graphics_world_to_screen(world_pos_02);
        uStack_2d0 = extraout_XMM0_Dc_11;
        local_2d8._0_4_ = vVar28.x;
        local_2d8._4_4_ = vVar28.y;
        uStack_2cc = extraout_XMM0_Dd_11;
        vVar48.z = local_218[0].z;
        vVar48.x = local_218[0].x;
        vVar48.y = local_218[0].y;
        vVar28 = golf_graphics_world_to_screen(vVar48);
        fVar23 = vec2_distance((vec2)local_2d8,vVar28);
        pgVar29 = local_260;
        fVar11 = (float)local_2e8._0_4_;
        if ((local_258.x <= 1.4 && 0.0 <= local_258.x) && fVar23 < (float)local_2e8._0_4_) {
          uVar44 = uVar39 & 0xffffffff;
          fVar11 = fVar23;
        }
        *(undefined8 *)((long)afStack_1e8 + lVar41) = local_218[0]._0_8_;
        *(float *)((long)afStack_1e8 + lVar41 + 8) = local_218[0].z;
        uVar39 = uVar39 + 1;
        lVar41 = lVar41 + 0xc;
      } while (uVar39 != 3);
      uVar34 = 0xffffffff;
      if (fVar11 < 8.0) {
        uVar34 = (uint)uVar44;
      }
      uVar39 = (ulong)uVar34;
      if (local_260->is_active == false) {
        if ((-1 < (int)uVar34) && (pgVar36->mouse_down[0] == true)) {
          local_260->is_active = true;
          (local_260->scale).axis = uVar34;
          fVar11 = (afStack_1e8 + uVar39 * 3)[1];
          (pgVar29->scale).start_point.x = (afStack_1e8 + uVar39 * 3)[0];
          (pgVar29->scale).start_point.y = fVar11;
          (local_260->scale).start_point.z = afStack_1e8[uVar39 * 3 + 2];
          fVar11 = (local_260->transform).scale.y;
          (pgVar29->scale).start_scale.x = (local_260->transform).scale.x;
          (pgVar29->scale).start_scale.y = fVar11;
          (local_260->scale).start_scale.z = (local_260->transform).scale.z;
          vVar48 = vec3_create(0.0,0.0,0.0);
          local_2e8._8_4_ = extraout_XMM0_Dc_21;
          local_2e8._0_8_ = vVar48._0_8_;
          local_2e8._12_4_ = extraout_XMM0_Dd_21;
          local_2d8._0_4_ = vVar48.z;
          vVar48 = vec3_create(0.0,0.0,0.0);
          uStack_2a0 = extraout_XMM0_Dc_22;
          local_2a8 = (undefined1  [8])vVar48._0_8_;
          uStack_29c = extraout_XMM0_Dd_22;
          local_298._0_4_ = vVar48.z;
          qVar49 = quat_create(0.0,0.0,0.0,1.0);
          auVar31 = _local_2a8;
          auVar30 = local_2e8;
          position_00.z = (float)local_2d8._0_4_;
          position_00.x = (float)local_2e8._0_4_;
          position_00.y = (float)local_2e8._4_4_;
          scale_00.z = (float)local_298._0_4_;
          scale_00.x = (float)local_2a8._0_4_;
          scale_00.y = (float)local_2a8._4_4_;
          local_2e8 = auVar30;
          _local_2a8 = auVar31;
          golf_transform((golf_transform_t *)local_138,position_00,scale_00,qVar49);
          (pgVar29->delta_transform).scale.y = avStack_130[3].x;
          (pgVar29->delta_transform).scale.z = avStack_130[3].y;
          (pgVar29->delta_transform).rotation.y = avStack_130[1].x;
          (pgVar29->delta_transform).rotation.z = avStack_130[1].y;
          *(vec2 *)&(pgVar29->delta_transform).rotation.w = avStack_130[2];
          (pgVar29->delta_transform).position.x = (float)local_138._0_4_;
          (pgVar29->delta_transform).position.y = (float)local_138._4_4_;
          *(ulong *)&(pgVar29->delta_transform).position.z =
               CONCAT44(avStack_130[0].y,avStack_130[0].x);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar36->mouse_down[0] == false) {
          pgVar29->is_active = false;
        }
        lVar41 = (long)(pgVar29->scale).axis;
        v1_14.z = afStack_1e8[lVar41 * 3 + 2];
        v1_14.x = (afStack_1e8 + lVar41 * 3)[0];
        v1_14.y = (afStack_1e8 + lVar41 * 3)[1];
        vVar48 = vec3_sub(v1_14,(pgVar29->scale).start_point);
        vVar48 = vec3_snap(vVar48,(pgVar29->scale).snap);
        local_2e8._8_4_ = extraout_XMM0_Dc_12;
        local_2e8._0_8_ = vVar48._0_8_;
        local_2e8._12_4_ = extraout_XMM0_Dd_12;
        local_2d8._0_4_ = vVar48.z;
        vVar48 = vec3_add((pgVar29->scale).start_scale,vVar48);
        auVar30 = local_2e8;
        (pgVar29->transform).scale.x = (float)(int)vVar48._0_8_;
        (pgVar29->transform).scale.y = (float)(int)((ulong)vVar48._0_8_ >> 0x20);
        (pgVar29->transform).scale.z = vVar48.z;
        (pgVar29->delta_transform).scale.x = (float)local_2e8._0_4_;
        (pgVar29->delta_transform).scale.y = (float)local_2e8._4_4_;
        (pgVar29->delta_transform).scale.z = (float)local_2d8._0_4_;
        local_2e8 = auVar30;
      }
      pfVar45 = &local_168[0].z;
      pfVar43 = &local_1b8.z;
      uVar44 = 0;
      do {
        auVar30 = local_2c8;
        world_pos_05.z = fVar8;
        world_pos_05.x = (float)local_2c8._0_4_;
        world_pos_05.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar28 = golf_graphics_world_to_screen(world_pos_05);
        uStack_2d0 = extraout_XMM0_Dc_23;
        local_2d8._0_4_ = vVar28.x;
        local_2d8._4_4_ = vVar28.y;
        uStack_2cc = extraout_XMM0_Dd_23;
        uVar10 = ((vec3 *)(pfVar43 + -2))->x;
        uVar22 = ((vec3 *)(pfVar43 + -2))->y;
        v_03.y = (float)uVar22;
        v_03.x = (float)uVar10;
        v_03.z = *pfVar43;
        vVar48 = vec3_scale(v_03,(float)local_278._0_4_);
        auVar30 = local_2c8;
        v1_16.z = fVar8;
        v1_16.x = (float)local_2c8._0_4_;
        v1_16.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar48 = vec3_add(v1_16,vVar48);
        vVar28 = golf_graphics_world_to_screen(vVar48);
        local_2e8._8_4_ = extraout_XMM0_Dc_24;
        local_2e8._0_4_ = vVar28.x;
        local_2e8._4_4_ = vVar28.y;
        local_2e8._12_4_ = extraout_XMM0_Dd_24;
        fVar11 = ((vec4 *)(pfVar45 + -2))->x;
        fVar23 = ((vec4 *)(pfVar45 + -2))->y;
        uVar4 = 0;
        uVar16 = 0;
        fVar9 = (float)*(undefined8 *)pfVar45;
        fVar20 = (float)((ulong)*(undefined8 *)pfVar45 >> 0x20);
        uVar46 = 0;
        uVar47 = 0;
        if (((pgVar29->is_active == false) && (uVar39 == uVar44)) ||
           ((pgVar29->is_active != false && (uVar44 == (uint)(pgVar29->scale).axis)))) {
          uVar46 = 0;
          uVar47 = 0;
          vVar50 = vec4_create(1.0,1.0,0.0,1.0);
          fVar9 = vVar50.z;
          fVar20 = vVar50.w;
          fVar11 = vVar50.x;
          fVar23 = vVar50.y;
          uVar4 = extraout_XMM0_Dc_25;
          uVar16 = extraout_XMM0_Dd_25;
        }
        local_2a8._4_4_ = fVar23;
        local_2a8._0_4_ = fVar11;
        uStack_2a0 = uVar4;
        uStack_29c = uVar16;
        local_298._4_4_ = fVar20;
        local_298._0_4_ = fVar9;
        uStack_290 = uVar46;
        uStack_28c = uVar47;
        col_02.z = (float)uVar52;
        col_02.w = SUB84(uVar52,4);
        col_02.x = (float)uVar51;
        col_02.y = SUB84(uVar51,4);
        IVar35 = igGetColorU32_Vec4(col_02);
        ImDrawList_AddLine(draw_list,(ImVec2)local_2d8,(ImVec2)local_2e8._0_8_,IVar35,4.0);
        col_03.z = (float)uVar52;
        col_03.w = SUB84(uVar52,4);
        col_03.x = (float)uVar51;
        col_03.y = SUB84(uVar51,4);
        IVar35 = igGetColorU32_Vec4(col_03);
        ImDrawList_AddCircleFilled(draw_list,(ImVec2)local_2e8._0_8_,7.5,IVar35,100);
        uVar44 = uVar44 + 1;
        pfVar45 = pfVar45 + 4;
        pfVar43 = pfVar43 + 3;
      } while (uVar44 != 3);
    }
    else if (gVar26 == GOLF_GIZMO_ROTATE) {
      local_170 = &(gizmo->transform).rotation;
      uVar4 = (pgVar36->mouse_ray_orig).x;
      uVar16 = (pgVar36->mouse_ray_orig).y;
      local_2e8._4_4_ = uVar16;
      local_2e8._0_4_ = uVar4;
      local_2d8._0_4_ = (pgVar36->mouse_ray_orig).z;
      uVar5 = (pgVar36->mouse_ray_dir).x;
      uVar17 = (pgVar36->mouse_ray_dir).y;
      local_2a8._4_4_ = uVar17;
      local_2a8._0_4_ = uVar5;
      _uStack_2a0 = 0;
      local_298._0_4_ = (pgVar36->mouse_ray_dir).z;
      local_2f8.x = (float)local_2c8._0_4_;
      local_2f8.y = (float)local_2c8._4_4_;
      local_280 = 3.4028235e+38;
      local_27c = 0xffffffff;
      lVar40 = 8;
      pvVar42 = &local_1b8;
      lVar41 = 0;
      local_2e8._8_8_ = 0;
      fVar11 = (float)local_2d8._0_4_;
      uVar51 = local_70.m._0_8_;
      uVar52 = local_70.m._8_8_;
      local_2f8.z = fVar8;
      local_2c8 = auVar30;
      do {
        plane_point.z = local_2f8.z;
        plane_point.x = local_2f8.x;
        plane_point.y = local_2f8.y;
        point.y = (float)uVar16;
        point.x = (float)uVar4;
        point.z = fVar11;
        vVar48 = closest_point_point_plane(point,plane_point,*pvVar42);
        v2.z = local_2f8.z;
        v2.x = local_2f8.x;
        v2.y = local_2f8.y;
        vVar48 = vec3_sub(vVar48,v2);
        vVar48 = vec3_set_length(vVar48,(float)local_278._0_4_);
        v1.z = local_2f8.z;
        v1.x = local_2f8.x;
        v1.y = local_2f8.y;
        vVar48 = vec3_add(v1,vVar48);
        auVar31 = _local_2a8;
        auVar30 = local_2e8;
        v1_10.z = vVar48.z;
        local_2c8._8_4_ = extraout_XMM0_Dc_03;
        local_2c8._0_8_ = vVar48._0_8_;
        local_2c8._12_4_ = extraout_XMM0_Dd_03;
        *(long *)((long)&uStack_1f0 + lVar40) = vVar48._0_8_;
        *(float *)((long)afStack_1e8 + lVar40) = v1_10.z;
        ro.z = (float)local_2d8._0_4_;
        ro.x = (float)local_2e8._0_4_;
        ro.y = (float)local_2e8._4_4_;
        rd.z = (float)local_298._0_4_;
        rd.x = (float)local_2a8._0_4_;
        rd.y = (float)local_2a8._4_4_;
        local_2e8 = auVar30;
        _local_2a8 = auVar31;
        _Var33 = ray_intersect_planes(ro,rd,&local_2f8,pvVar42,1,&local_258.x,(int *)&local_2ac);
        auVar30 = _local_2a8;
        if (_Var33) {
          v_01.z = (float)local_298._0_4_;
          v_01.x = (float)local_2a8._0_4_;
          v_01.y = (float)local_2a8._4_4_;
          _local_2a8 = auVar30;
          vVar48 = vec3_scale(v_01,local_258.x);
          auVar30 = local_2e8;
          v1_09.z = (float)local_2d8._0_4_;
          v1_09.x = (float)local_2e8._0_4_;
          v1_09.y = (float)local_2e8._4_4_;
          local_2e8 = auVar30;
          vVar48 = vec3_add(v1_09,vVar48);
          v2_00.z = local_2f8.z;
          v2_00.x = local_2f8.x;
          v2_00.y = local_2f8.y;
          local_188._8_4_ = extraout_XMM0_Dc_04;
          local_188._0_8_ = vVar48._0_8_;
          local_188._12_4_ = extraout_XMM0_Dd_04;
          local_260 = (golf_gizmo_t *)CONCAT44(local_260._4_4_,vVar48.z);
          vVar48 = vec3_sub(vVar48,v2_00);
          vVar48 = vec3_set_length(vVar48,(float)local_278._0_4_);
          v1_00.z = local_2f8.z;
          v1_00.x = local_2f8.x;
          v1_00.y = local_2f8.y;
          vVar48 = vec3_add(v1_00,vVar48);
          auVar30 = local_2c8;
          uStack_230 = extraout_XMM0_Dc_05;
          local_238 = (undefined1  [8])vVar48._0_8_;
          uStack_22c = extraout_XMM0_Dd_05;
          local_248._0_4_ = vVar48.z;
          *(long *)((long)&uStack_220 + lVar40) = vVar48._0_8_;
          *(float *)((long)&local_218[0].x + lVar40) = vVar48.z;
          v2_01.z = local_2f8.z;
          v2_01.x = local_2f8.x;
          v2_01.y = local_2f8.y;
          v1_10.x = (float)local_2c8._0_4_;
          v1_10.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          vVar48 = vec3_sub(v1_10,v2_01);
          auVar30 = _local_238;
          u.z = vVar48.z;
          local_2c8._8_4_ = extraout_XMM0_Dc_06;
          local_2c8._0_8_ = vVar48._0_8_;
          local_2c8._12_4_ = extraout_XMM0_Dd_06;
          v2_02.z = local_2f8.z;
          v2_02.x = local_2f8.x;
          v2_02.y = local_2f8.y;
          v1_11.z = (float)local_248._0_4_;
          v1_11.x = (float)local_238._0_4_;
          v1_11.y = (float)local_238._4_4_;
          _local_238 = auVar30;
          vVar48 = vec3_sub(v1_11,v2_02);
          auVar30 = local_2c8;
          u.x = (float)local_2c8._0_4_;
          u.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          qVar49 = quat_between_vectors(u,vVar48);
          quat_get_axis_angle(qVar49,(vec3 *)local_138,(float *)((long)&uStack_220 + 4));
          auVar30 = local_188;
          if (ABS(uStack_220._4_4_) <= 1.5707964) {
            world_pos_03.z = local_260._0_4_;
            world_pos_03.x = (float)local_188._0_4_;
            world_pos_03.y = (float)local_188._4_4_;
            local_188 = auVar30;
            vVar28 = golf_graphics_world_to_screen(world_pos_03);
            auVar30 = _local_238;
            local_2c8._8_4_ = extraout_XMM0_Dc_07;
            local_2c8._0_4_ = vVar28.x;
            local_2c8._4_4_ = vVar28.y;
            local_2c8._12_4_ = extraout_XMM0_Dd_07;
            world_pos_04.z = (float)local_248._0_4_;
            world_pos_04.x = (float)local_238._0_4_;
            world_pos_04.y = (float)local_238._4_4_;
            _local_238 = auVar30;
            vVar28 = golf_graphics_world_to_screen(world_pos_04);
            fVar8 = vec2_distance((vec2)local_2c8._0_8_,vVar28);
            if (fVar8 < local_280) {
              local_27c = (uint)lVar41;
              local_280 = fVar8;
            }
          }
        }
        lVar41 = lVar41 + 1;
        lVar40 = lVar40 + 0xc;
        pvVar42 = pvVar42 + 1;
        fVar11 = (float)local_2d8._0_4_;
        uVar4 = local_2e8._0_4_;
        uVar16 = local_2e8._4_4_;
      } while (lVar41 != 3);
      uVar34 = 0xffffffff;
      if (local_280 < 8.0) {
        uVar34 = local_27c;
      }
      uVar39 = (ulong)uVar34;
      if (gizmo->is_active == false) {
        if ((-1 < (int)uVar34) && (pgVar36->mouse_down[0] == true)) {
          gizmo->is_active = true;
          (gizmo->rotate).axis = uVar34;
          (gizmo->rotate).axis_rotation.z = (&local_1b8)[uVar39].z;
          fVar8 = (&local_1b8)[uVar39].y;
          (gizmo->rotate).axis_rotation.x = (&local_1b8)[uVar39].x;
          (gizmo->rotate).axis_rotation.y = fVar8;
          fVar8 = local_218[uVar39].y;
          (gizmo->rotate).start_point.x = local_218[uVar39].x;
          (gizmo->rotate).start_point.y = fVar8;
          (gizmo->rotate).start_point.z = local_218[uVar39].z;
          fVar8 = local_170->y;
          fVar11 = local_170->z;
          fVar23 = local_170->w;
          (gizmo->rotate).start_rotation.x = local_170->x;
          (gizmo->rotate).start_rotation.y = fVar8;
          (gizmo->rotate).start_rotation.z = fVar11;
          (gizmo->rotate).start_rotation.w = fVar23;
          vVar48 = vec3_create(0.0,0.0,0.0);
          position.z = vVar48.z;
          local_2c8._8_4_ = extraout_XMM0_Dc_13;
          local_2c8._0_8_ = vVar48._0_8_;
          local_2c8._12_4_ = extraout_XMM0_Dd_13;
          vVar48 = vec3_create(0.0,0.0,0.0);
          local_278._8_4_ = extraout_XMM0_Dc_14;
          local_278._0_8_ = vVar48._0_8_;
          local_278._12_4_ = extraout_XMM0_Dd_14;
          local_2e8._0_4_ = vVar48.z;
          qVar49 = quat_create(0.0,0.0,0.0,1.0);
          auVar31 = local_278;
          auVar30 = local_2c8;
          position.x = (float)local_2c8._0_4_;
          position.y = (float)local_2c8._4_4_;
          scale.z = (float)local_2e8._0_4_;
          scale.x = (float)local_278._0_4_;
          scale.y = (float)local_278._4_4_;
          local_2c8 = auVar30;
          local_278 = auVar31;
          golf_transform((golf_transform_t *)local_138,position,scale,qVar49);
          (gizmo->delta_transform).scale.y = avStack_130[3].x;
          (gizmo->delta_transform).scale.z = avStack_130[3].y;
          (gizmo->delta_transform).rotation.y = avStack_130[1].x;
          (gizmo->delta_transform).rotation.z = avStack_130[1].y;
          *(vec2 *)&(gizmo->delta_transform).rotation.w = avStack_130[2];
          (gizmo->delta_transform).position.x = (float)local_138._0_4_;
          (gizmo->delta_transform).position.y = (float)local_138._4_4_;
          *(ulong *)&(gizmo->delta_transform).position.z =
               CONCAT44(avStack_130[0].y,avStack_130[0].x);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar36->mouse_down[0] == false) {
          gizmo->is_active = false;
        }
        iVar38 = (gizmo->rotate).axis;
        v2_03.z = local_2f8.z;
        v2_03.x = local_2f8.x;
        v2_03.y = local_2f8.y;
        vVar48 = vec3_sub((gizmo->rotate).start_point,v2_03);
        vVar48 = vec3_normalize(vVar48);
        u_00.z = vVar48.z;
        local_2c8._8_4_ = extraout_XMM0_Dc_08;
        local_2c8._0_8_ = vVar48._0_8_;
        local_2c8._12_4_ = extraout_XMM0_Dd_08;
        uVar6 = local_218[iVar38].x;
        uVar18 = local_218[iVar38].y;
        v1_12.y = (float)uVar18;
        v1_12.x = (float)uVar6;
        v2_04.z = local_2f8.z;
        v2_04.x = local_2f8.x;
        v2_04.y = local_2f8.y;
        v1_12.z = local_218[iVar38].z;
        vVar48 = vec3_sub(v1_12,v2_04);
        vVar48 = vec3_normalize(vVar48);
        auVar30 = local_2c8;
        u_00.x = (float)local_2c8._0_4_;
        u_00.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        qVar49 = quat_between_vectors(u_00,vVar48);
        quat_get_axis_angle(qVar49,&local_258,&local_2ac);
        if ((local_2ac != 0.0) || (NAN(local_2ac))) {
          v1_06.y = local_258.y;
          v1_06.z = local_258.z;
          v1_06.x = local_258.x;
          fVar8 = vec3_dot(v1_06,(gizmo->rotate).axis_rotation);
          if (fVar8 < 0.0) {
            local_2ac = -local_2ac;
          }
          local_2ac = golf_snapf(local_2ac,(gizmo->rotate).snap * 0.017453292);
          uVar4 = 0;
          uVar16 = 0;
          qVar49 = quat_create_from_axis_angle((gizmo->rotate).axis_rotation,local_2ac);
          local_2e8._8_4_ = extraout_XMM0_Dc_09;
          local_2e8._0_8_ = qVar49._0_8_;
          local_2e8._12_4_ = extraout_XMM0_Dd_09;
          uStack_2d0 = uVar4;
          local_2d8 = (undefined1  [8])qVar49._8_8_;
          uStack_2cc = uVar16;
          qVar49 = quat_multiply(qVar49,(gizmo->rotate).start_rotation);
          (gizmo->transform).rotation = qVar49;
          (gizmo->delta_transform).rotation.x = (float)local_2e8._0_4_;
          (gizmo->delta_transform).rotation.y = (float)local_2e8._4_4_;
          (gizmo->delta_transform).rotation.z = local_2d8._0_4_;
          (gizmo->delta_transform).rotation.w = local_2d8._4_4_;
        }
        world_pos.z = local_2f8.z;
        world_pos.x = local_2f8.x;
        world_pos.y = local_2f8.y;
        local_138 = (undefined1  [8])golf_graphics_world_to_screen(world_pos);
        lVar41 = 0;
        do {
          auVar30 = local_2c8;
          vec.z = u_00.z;
          vec.x = (float)local_2c8._0_4_;
          vec.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          vVar48 = vec3_rotate_about_axis
                             (vec,(gizmo->rotate).axis_rotation,
                              ((float)(int)lVar41 / 23.0) * local_2ac);
          vVar48 = vec3_scale(vVar48,(float)local_278._0_4_);
          v1_01.z = local_2f8.z;
          v1_01.x = local_2f8.x;
          v1_01.y = local_2f8.y;
          vVar48 = vec3_add(v1_01,vVar48);
          vVar28 = golf_graphics_world_to_screen(vVar48);
          avStack_130[lVar41] = vVar28;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0x18);
        vec4_create(1.0,1.0,1.0,0.4);
        col.z = (float)uVar52;
        col.w = SUB84(uVar52,4);
        col.x = (float)uVar51;
        col.y = SUB84(uVar51,4);
        IVar35 = igGetColorU32_Vec4(col);
        ImDrawList_AddConvexPolyFilled(draw_list,(ImVec2 *)local_138,0x19,IVar35);
      }
      uVar44 = 0;
      do {
        fVar8 = local_168[uVar44].x;
        fVar20 = local_168[uVar44].y;
        uVar4 = 0;
        uVar16 = 0;
        fVar9 = local_168[uVar44].z;
        fVar21 = local_168[uVar44].w;
        uVar46 = 0;
        uVar47 = 0;
        if (((gizmo->is_active == false) && (uVar44 == uVar39)) ||
           ((gizmo->is_active != false && (uVar44 == (uint)(gizmo->rotate).axis)))) {
          uVar46 = 0;
          uVar47 = 0;
          vVar50 = vec4_create(1.0,1.0,0.0,1.0);
          fVar9 = vVar50.z;
          fVar21 = vVar50.w;
          fVar8 = vVar50.x;
          fVar20 = vVar50.y;
          uVar4 = extraout_XMM0_Dc_15;
          uVar16 = extraout_XMM0_Dd_15;
        }
        local_2a8._4_4_ = fVar21;
        local_2a8._0_4_ = fVar9;
        uStack_2a0 = uVar46;
        uStack_29c = uVar47;
        local_2d8._4_4_ = fVar20;
        local_2d8._0_4_ = fVar8;
        uStack_2d0 = uVar4;
        uStack_2cc = uVar16;
        local_248._8_8_ = 0;
        local_248._0_8_ = *(ulong *)(afStack_1e8 + uVar44 * 3);
        local_188._0_4_ = afStack_1e8[uVar44 * 3 + 2];
        pvVar42 = &local_1b8 + uVar44;
        iVar38 = 1;
        do {
          auVar30 = local_248;
          local_2e8 = ZEXT416((uint)(((float)(iVar38 + -1) / 20.0) * 1.5707964));
          local_278 = ZEXT416((uint)(((float)iVar38 / 20.0) * 1.5707964));
          v2_05.z = local_2f8.z;
          v2_05.x = local_2f8.x;
          v2_05.y = local_2f8.y;
          v1_15.z = (float)local_188._0_4_;
          v1_15.x = (float)local_248._0_4_;
          v1_15.y = (float)local_248._4_4_;
          local_248 = auVar30;
          vVar48 = vec3_sub(v1_15,v2_05);
          vec_00.z = vVar48.z;
          local_2c8._8_4_ = extraout_XMM0_Dc_16;
          local_2c8._0_8_ = vVar48._0_8_;
          local_2c8._12_4_ = extraout_XMM0_Dd_16;
          vVar48 = vec3_rotate_about_axis(vVar48,*pvVar42,(float)local_2e8._0_4_);
          v1_02.z = local_2f8.z;
          v1_02.x = local_2f8.x;
          v1_02.y = local_2f8.y;
          vVar48 = vec3_add(v1_02,vVar48);
          vVar28 = golf_graphics_world_to_screen(vVar48);
          auVar30 = local_2c8;
          uStack_290 = extraout_XMM0_Dc_17;
          local_298._0_4_ = vVar28.x;
          local_298._4_4_ = vVar28.y;
          uStack_28c = extraout_XMM0_Dd_17;
          vec_00.x = (float)local_2c8._0_4_;
          vec_00.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          vVar48 = vec3_rotate_about_axis(vec_00,*pvVar42,(float)local_278._0_4_);
          v1_03.z = local_2f8.z;
          v1_03.x = local_2f8.x;
          v1_03.y = local_2f8.y;
          vVar48 = vec3_add(v1_03,vVar48);
          vVar28 = golf_graphics_world_to_screen(vVar48);
          uStack_230 = extraout_XMM0_Dc_18;
          local_238._0_4_ = vVar28.x;
          local_238._4_4_ = vVar28.y;
          uStack_22c = extraout_XMM0_Dd_18;
          col_00.z = (float)uVar52;
          col_00.w = SUB84(uVar52,4);
          col_00.x = (float)uVar51;
          col_00.y = SUB84(uVar51,4);
          IVar35 = igGetColorU32_Vec4(col_00);
          ImDrawList_AddLine(draw_list,(ImVec2)local_298,(ImVec2)local_238,IVar35,4.0);
          auVar30 = local_2c8;
          vec_01.z = vec_00.z;
          vec_01.x = (float)local_2c8._0_4_;
          vec_01.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          vVar48 = vec3_rotate_about_axis(vec_01,*pvVar42,-(float)local_2e8._0_4_);
          v1_04.z = local_2f8.z;
          v1_04.x = local_2f8.x;
          v1_04.y = local_2f8.y;
          vVar48 = vec3_add(v1_04,vVar48);
          vVar28 = golf_graphics_world_to_screen(vVar48);
          auVar30 = local_2c8;
          local_2e8._8_4_ = extraout_XMM0_Dc_19;
          local_2e8._0_4_ = vVar28.x;
          local_2e8._4_4_ = vVar28.y;
          local_2e8._12_4_ = extraout_XMM0_Dd_19;
          vec_02.z = vec_00.z;
          vec_02.x = (float)local_2c8._0_4_;
          vec_02.y = (float)local_2c8._4_4_;
          local_2c8 = auVar30;
          vVar48 = vec3_rotate_about_axis(vec_02,*pvVar42,-(float)local_278._0_4_);
          v1_05.z = local_2f8.z;
          v1_05.x = local_2f8.x;
          v1_05.y = local_2f8.y;
          vVar48 = vec3_add(v1_05,vVar48);
          vVar28 = golf_graphics_world_to_screen(vVar48);
          local_2c8._8_4_ = extraout_XMM0_Dc_20;
          local_2c8._0_4_ = vVar28.x;
          local_2c8._4_4_ = vVar28.y;
          local_2c8._12_4_ = extraout_XMM0_Dd_20;
          col_01.z = (float)uVar52;
          col_01.w = SUB84(uVar52,4);
          col_01.x = (float)uVar51;
          col_01.y = SUB84(uVar51,4);
          IVar35 = igGetColorU32_Vec4(col_01);
          ImDrawList_AddLine(draw_list,(ImVec2)local_2e8._0_8_,(ImVec2)local_2c8._0_8_,IVar35,4.0);
          iVar38 = iVar38 + 1;
        } while (iVar38 != 0x15);
        uVar44 = uVar44 + 1;
      } while (uVar44 != 3);
    }
    else if (gVar26 == GOLF_GIZMO_TRANSLATE) {
      local_248._0_8_ = &gizmo->transform;
      fVar11 = 3.4028235e+38;
      uVar44 = 0xffffffff;
      lVar41 = 0;
      uVar39 = 0;
      uVar51 = local_70.m._0_8_;
      uVar52 = local_70.m._8_8_;
      local_260 = gizmo;
      do {
        local_2e8._0_4_ = fVar11;
        pvVar42 = &pgVar36->mouse_ray_orig;
        uVar3 = pvVar42->x;
        uVar15 = pvVar42->y;
        local_2d8._4_4_ = uVar15;
        local_2d8._0_4_ = uVar3;
        _uStack_2d0 = 0;
        local_2a8._0_4_ = (pgVar36->mouse_ray_orig).z;
        vVar48 = vec3_add(*pvVar42,pgVar36->mouse_ray_dir);
        uStack_290 = extraout_XMM0_Dc;
        local_298 = (undefined1  [8])vVar48._0_8_;
        uStack_28c = extraout_XMM0_Dd;
        local_238._0_4_ = vVar48.z;
        v.z = *(float *)((long)&local_1b8.z + lVar41);
        v._0_8_ = *(undefined8 *)((long)&local_1b8.x + lVar41);
        vVar48 = vec3_scale(v,(float)local_278._0_4_);
        auVar30 = local_2c8;
        v1_07.z = fVar8;
        v1_07.x = (float)local_2c8._0_4_;
        v1_07.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar48 = vec3_add(v1_07,vVar48);
        auVar32 = _local_298;
        auVar31 = local_2c8;
        auVar30 = _local_2d8;
        p1.z = (float)local_2a8._0_4_;
        p1.x = (float)local_2d8._0_4_;
        p1.y = (float)local_2d8._4_4_;
        q1.z = (float)local_238._0_4_;
        q1.x = (float)local_298._0_4_;
        q1.y = (float)local_298._4_4_;
        p2.z = fVar8;
        p2.x = (float)local_2c8._0_4_;
        p2.y = (float)local_2c8._4_4_;
        _local_2d8 = auVar30;
        local_2c8 = auVar31;
        _local_298 = auVar32;
        closest_point_ray_ray(p1,q1,p2,vVar48,&local_2f8.x,&local_258.x,(vec3 *)local_138,local_218)
        ;
        world_pos_01.z = avStack_130[0].x;
        world_pos_01.x = (float)local_138._0_4_;
        world_pos_01.y = (float)local_138._4_4_;
        vVar28 = golf_graphics_world_to_screen(world_pos_01);
        uStack_2d0 = extraout_XMM0_Dc_00;
        local_2d8._0_4_ = vVar28.x;
        local_2d8._4_4_ = vVar28.y;
        uStack_2cc = extraout_XMM0_Dd_00;
        world_pos_00.z = local_218[0].z;
        world_pos_00.x = local_218[0].x;
        world_pos_00.y = local_218[0].y;
        vVar28 = golf_graphics_world_to_screen(world_pos_00);
        fVar23 = vec2_distance((vec2)local_2d8,vVar28);
        pgVar29 = local_260;
        fVar11 = (float)local_2e8._0_4_;
        if ((local_258.x <= 1.4 && 0.0 <= local_258.x) && fVar23 < (float)local_2e8._0_4_) {
          uVar44 = uVar39 & 0xffffffff;
          fVar11 = fVar23;
        }
        *(undefined8 *)((long)afStack_1e8 + lVar41) = local_218[0]._0_8_;
        *(float *)((long)afStack_1e8 + lVar41 + 8) = local_218[0].z;
        uVar39 = uVar39 + 1;
        lVar41 = lVar41 + 0xc;
      } while (uVar39 != 3);
      uVar34 = 0xffffffff;
      if (fVar11 < 8.0) {
        uVar34 = (uint)uVar44;
      }
      uVar39 = (ulong)uVar34;
      if (local_260->is_active == false) {
        if ((-1 < (int)uVar34) && (pgVar36->mouse_down[0] == true)) {
          local_260->is_active = true;
          (local_260->translate).axis = uVar34;
          fVar11 = (afStack_1e8 + uVar39 * 3)[1];
          (pgVar29->translate).start_point.x = (afStack_1e8 + uVar39 * 3)[0];
          (pgVar29->translate).start_point.y = fVar11;
          (local_260->translate).start_point.z = afStack_1e8[uVar39 * 3 + 2];
          uVar27 = *(undefined8 *)local_248._0_8_;
          (pgVar29->translate).start_position.x = (float)(int)uVar27;
          (pgVar29->translate).start_position.y = (float)(int)((ulong)uVar27 >> 0x20);
          (local_260->translate).start_position.z = *(float *)(local_248._0_8_ + 8);
          vVar48 = vec3_create(0.0,0.0,0.0);
          local_2e8._8_4_ = extraout_XMM0_Dc_26;
          local_2e8._0_8_ = vVar48._0_8_;
          local_2e8._12_4_ = extraout_XMM0_Dd_26;
          local_2d8._0_4_ = vVar48.z;
          vVar48 = vec3_create(0.0,0.0,0.0);
          uStack_2a0 = extraout_XMM0_Dc_27;
          local_2a8 = (undefined1  [8])vVar48._0_8_;
          uStack_29c = extraout_XMM0_Dd_27;
          local_298._0_4_ = vVar48.z;
          qVar49 = quat_create(0.0,0.0,0.0,1.0);
          auVar31 = _local_2a8;
          auVar30 = local_2e8;
          position_01.z = (float)local_2d8._0_4_;
          position_01.x = (float)local_2e8._0_4_;
          position_01.y = (float)local_2e8._4_4_;
          scale_01.z = (float)local_298._0_4_;
          scale_01.x = (float)local_2a8._0_4_;
          scale_01.y = (float)local_2a8._4_4_;
          local_2e8 = auVar30;
          _local_2a8 = auVar31;
          golf_transform((golf_transform_t *)local_138,position_01,scale_01,qVar49);
          (pgVar29->delta_transform).scale.y = avStack_130[3].x;
          (pgVar29->delta_transform).scale.z = avStack_130[3].y;
          (pgVar29->delta_transform).rotation.y = avStack_130[1].x;
          (pgVar29->delta_transform).rotation.z = avStack_130[1].y;
          *(vec2 *)&(pgVar29->delta_transform).rotation.w = avStack_130[2];
          (pgVar29->delta_transform).position.x = (float)local_138._0_4_;
          (pgVar29->delta_transform).position.y = (float)local_138._4_4_;
          *(ulong *)&(pgVar29->delta_transform).position.z =
               CONCAT44(avStack_130[0].y,avStack_130[0].x);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if (pgVar36->mouse_down[0] == false) {
          pgVar29->is_active = false;
        }
        lVar41 = (long)(pgVar29->translate).axis;
        v1_08.z = afStack_1e8[lVar41 * 3 + 2];
        v1_08.x = (afStack_1e8 + lVar41 * 3)[0];
        v1_08.y = (afStack_1e8 + lVar41 * 3)[1];
        vVar48 = vec3_sub(v1_08,(pgVar29->translate).start_point);
        local_2e8._8_4_ = extraout_XMM0_Dc_01;
        local_2e8._0_8_ = vVar48._0_8_;
        local_2e8._12_4_ = extraout_XMM0_Dd_01;
        local_2d8._0_4_ = vVar48.z;
        fVar11 = vec3_length(vVar48);
        fVar11 = golf_snapf(fVar11,(pgVar29->translate).snap);
        auVar30 = local_2e8;
        v_00.z = (float)local_2d8._0_4_;
        v_00.x = (float)local_2e8._0_4_;
        v_00.y = (float)local_2e8._4_4_;
        local_2e8 = auVar30;
        vVar48 = vec3_set_length(v_00,fVar11);
        local_2e8._8_4_ = extraout_XMM0_Dc_02;
        local_2e8._0_8_ = vVar48._0_8_;
        local_2e8._12_4_ = extraout_XMM0_Dd_02;
        local_2d8._0_4_ = vVar48.z;
        vVar48 = vec3_add((pgVar29->translate).start_position,vVar48);
        auVar30 = local_2e8;
        (pgVar29->transform).position.x = (float)(int)vVar48._0_8_;
        (pgVar29->transform).position.y = (float)(int)((ulong)vVar48._0_8_ >> 0x20);
        (pgVar29->transform).position.z = vVar48.z;
        (pgVar29->delta_transform).position.x = (float)local_2e8._0_4_;
        (pgVar29->delta_transform).position.y = (float)local_2e8._4_4_;
        (pgVar29->delta_transform).position.z = (float)local_2d8._0_4_;
        local_2e8 = auVar30;
      }
      pfVar45 = &local_168[0].z;
      pfVar43 = &local_1b8.z;
      uVar44 = 0;
      do {
        auVar30 = local_2c8;
        world_pos_06.z = fVar8;
        world_pos_06.x = (float)local_2c8._0_4_;
        world_pos_06.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar28 = golf_graphics_world_to_screen(world_pos_06);
        uStack_2d0 = extraout_XMM0_Dc_28;
        local_2d8._0_4_ = vVar28.x;
        local_2d8._4_4_ = vVar28.y;
        uStack_2cc = extraout_XMM0_Dd_28;
        uVar12 = ((vec3 *)(pfVar43 + -2))->x;
        uVar24 = ((vec3 *)(pfVar43 + -2))->y;
        v_04.y = (float)uVar24;
        v_04.x = (float)uVar12;
        v_04.z = *pfVar43;
        vVar48 = vec3_scale(v_04,(float)local_278._0_4_);
        auVar30 = local_2c8;
        v1_17.z = fVar8;
        v1_17.x = (float)local_2c8._0_4_;
        v1_17.y = (float)local_2c8._4_4_;
        local_2c8 = auVar30;
        vVar48 = vec3_add(v1_17,vVar48);
        vVar28 = golf_graphics_world_to_screen(vVar48);
        local_2e8._8_4_ = extraout_XMM0_Dc_29;
        local_2e8._0_4_ = vVar28.x;
        local_2e8._4_4_ = vVar28.y;
        local_2e8._12_4_ = extraout_XMM0_Dd_29;
        fVar13 = ((vec4 *)(pfVar45 + -2))->x;
        fVar25 = ((vec4 *)(pfVar45 + -2))->y;
        uVar4 = 0;
        uVar16 = 0;
        fVar11 = (float)*(undefined8 *)pfVar45;
        fVar23 = (float)((ulong)*(undefined8 *)pfVar45 >> 0x20);
        uVar46 = 0;
        uVar47 = 0;
        if (((pgVar29->is_active == false) && (uVar39 == uVar44)) ||
           ((pgVar29->is_active != false && (uVar44 == (uint)(pgVar29->translate).axis)))) {
          uVar46 = 0;
          uVar47 = 0;
          vVar50 = vec4_create(1.0,1.0,0.0,1.0);
          fVar11 = vVar50.z;
          fVar23 = vVar50.w;
          fVar13 = vVar50.x;
          fVar25 = vVar50.y;
          uVar4 = extraout_XMM0_Dc_30;
          uVar16 = extraout_XMM0_Dd_30;
        }
        local_298._4_4_ = fVar25;
        local_298._0_4_ = fVar13;
        uStack_290 = uVar4;
        uStack_28c = uVar16;
        local_238._4_4_ = fVar23;
        local_238._0_4_ = fVar11;
        uStack_230 = uVar46;
        uStack_22c = uVar47;
        col_04.z = (float)uVar52;
        col_04.w = SUB84(uVar52,4);
        col_04.x = (float)uVar51;
        col_04.y = SUB84(uVar51,4);
        IVar35 = igGetColorU32_Vec4(col_04);
        ImDrawList_AddLine(draw_list,(ImVec2)local_2d8,(ImVec2)local_2e8._0_8_,IVar35,4.0);
        vVar28 = vec2_sub((vec2)local_2e8._0_8_,(vec2)local_2d8);
        vVar28 = vec2_normalize(vVar28);
        uStack_2d0 = extraout_XMM0_Dc_31;
        local_2d8._0_4_ = vVar28.x;
        local_2d8._4_4_ = vVar28.y;
        uStack_2cc = extraout_XMM0_Dd_31;
        vVar28 = vec2_rotate(vVar28,1.5707964);
        uStack_2a0 = extraout_XMM0_Dc_32;
        local_2a8._0_4_ = vVar28.x;
        local_2a8._4_4_ = vVar28.y;
        uStack_29c = extraout_XMM0_Dd_32;
        vVar28 = vec2_scale((vec2)local_2d8,-6.4951906);
        local_248._8_4_ = extraout_XMM0_Dc_33;
        local_248._0_4_ = vVar28.x;
        local_248._4_4_ = vVar28.y;
        local_248._12_4_ = extraout_XMM0_Dd_33;
        vVar28 = vec2_scale((vec2)local_2a8,-7.5);
        vVar28 = vec2_add((vec2)local_248._0_8_,vVar28);
        vVar28 = vec2_add((vec2)local_2e8._0_8_,vVar28);
        local_248._8_4_ = extraout_XMM0_Dc_34;
        local_248._0_4_ = vVar28.x;
        local_248._4_4_ = vVar28.y;
        local_248._12_4_ = extraout_XMM0_Dd_34;
        vVar28 = vec2_scale((vec2)local_2d8,-6.4951906);
        local_188._8_4_ = extraout_XMM0_Dc_35;
        local_188._0_4_ = vVar28.x;
        local_188._4_4_ = vVar28.y;
        local_188._12_4_ = extraout_XMM0_Dd_35;
        vVar28 = vec2_scale((vec2)local_2a8,7.5);
        vVar28 = vec2_add((vec2)local_188._0_8_,vVar28);
        vVar28 = vec2_add((vec2)local_2e8._0_8_,vVar28);
        uStack_2a0 = extraout_XMM0_Dc_36;
        local_2a8._0_4_ = vVar28.x;
        local_2a8._4_4_ = vVar28.y;
        uStack_29c = extraout_XMM0_Dd_36;
        vVar28 = vec2_scale((vec2)local_2d8,6.4951906);
        vVar28 = vec2_add((vec2)local_2e8._0_8_,vVar28);
        local_2e8._8_4_ = extraout_XMM0_Dc_37;
        local_2e8._0_4_ = vVar28.x;
        local_2e8._4_4_ = vVar28.y;
        local_2e8._12_4_ = extraout_XMM0_Dd_37;
        col_05.z = (float)uVar52;
        col_05.w = SUB84(uVar52,4);
        col_05.x = (float)uVar51;
        col_05.y = SUB84(uVar51,4);
        IVar35 = igGetColorU32_Vec4(col_05);
        ImDrawList_AddTriangleFilled
                  (draw_list,(ImVec2)local_248._0_8_,(ImVec2)local_2a8,(ImVec2)local_2e8._0_8_,
                   IVar35);
        uVar44 = uVar44 + 1;
        pfVar45 = pfVar45 + 4;
        pfVar43 = pfVar43 + 3;
      } while (uVar44 != 3);
    }
  }
  return;
}

Assistant:

void golf_gizmo_update(golf_gizmo_t *gizmo, ImDrawList *draw_list) {
    if (!gizmo->is_on) {
        return;
    }

    golf_inputs_t *inputs = golf_inputs_get();
    golf_graphics_t *graphics = golf_graphics_get();

    vec3 p = gizmo->transform.position;
    float dist_modifier = 0.1f * vec3_distance(graphics->cam_pos, p);

    mat4 model_mat = mat4_from_quat(gizmo->transform.rotation);
    vec3 axis[3] = {
        vec3_apply_mat4(V3(1, 0, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 1, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 0, 1), 0, model_mat),
    };
    vec4 color[3] = { 
        V4(1, 0, 0, 1),
        V4(0, 1, 0, 1),
        V4(0, 0, 1, 1) 
    };

    if (gizmo->operation == GOLF_GIZMO_TRANSLATE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->translate.axis;
            vec3 translate = vec3_sub(closest_point[axis_i], gizmo->translate.start_point);
            float dist = golf_snapf(vec3_length(translate), gizmo->translate.snap);
            translate = vec3_set_length(translate, dist);
            gizmo->transform.position = vec3_add(gizmo->translate.start_position, translate);
            gizmo->delta_transform.position = translate;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->translate.axis = hovered_axis;
                gizmo->translate.start_point = closest_point[hovered_axis];
                gizmo->translate.start_position = gizmo->transform.position;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->translate.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float w = 15;
            float h = sqrtf(3.0f) / 2.0f * w;
            vec2 dir0 = vec2_normalize(vec2_sub(p1, p0));
            vec2 dir1 = vec2_rotate(dir0, 0.5f * MF_PI);
            vec2 t_p0 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, -0.5f * w)));
            vec2 t_p1 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, 0.5f * w)));
            vec2 t_p2 = vec2_add(p1, vec2_scale(dir0, 0.5f * h));
            _add_triangle(draw_list, t_p0, t_p1, t_p2, col);
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_ROTATE) {
        vec3 ro = inputs->mouse_ray_orig;
        vec3 rd = inputs->mouse_ray_dir;
        vec3 cc = p;
        float cr = 1 * dist_modifier;

        vec3 circle_p0[3], circle_p[3];
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        for (int i = 0; i < 3; i++) {
            circle_p0[i] = closest_point_point_plane(ro, cc, axis[i]);
            circle_p0[i] = vec3_add(cc, vec3_set_length(vec3_sub(circle_p0[i], cc), cr));

            float t;
            int idx;
            if (!ray_intersect_planes(ro, rd, &cc, &axis[i], 1, &t, &idx)) {
                continue;
            }

            vec3 plane_p = vec3_add(ro, vec3_scale(rd, t));
            circle_p[i] = vec3_add(cc, vec3_set_length(vec3_sub(plane_p, cc), cr));

            quat r = quat_between_vectors(vec3_sub(circle_p0[i], cc), vec3_sub(circle_p[i], cc));
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);
            if (r_angle > 0.5f * MF_PI || r_angle < -0.5f * MF_PI) {
                continue;
            }

            float screen_dist = vec2_distance(_world_to_screen(plane_p), _world_to_screen(circle_p[i]));
            if (screen_dist < closest_dist) {
                closest_axis = i;
                closest_dist = screen_dist;
            }
        }

        float hover_dist = 8;
        int hovered_axis = -1;
        if (closest_dist < hover_dist) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->rotate.axis;
            vec3 dir0 = vec3_normalize(vec3_sub(gizmo->rotate.start_point, cc));
            vec3 dir1 = vec3_normalize(vec3_sub(circle_p[axis_i], cc));
            quat r = quat_between_vectors(dir0, dir1);
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);

            if (r_angle != 0) {
                if (vec3_dot(r_axis, gizmo->rotate.axis_rotation) < 0.0f) {
                    r_angle *= -1.0f;
                }
                r_angle = golf_snapf(r_angle, gizmo->rotate.snap * (MF_PI / 180.0f));
                quat rotation = quat_create_from_axis_angle(gizmo->rotate.axis_rotation, r_angle);
                gizmo->transform.rotation = quat_multiply(rotation, gizmo->rotate.start_rotation);
                gizmo->delta_transform.rotation = rotation;
            }

            int num_points = 25;
            vec2 points[25];
            points[0] = _world_to_screen(cc);
            for (int i = 1; i < num_points; i++) {
                float t = r_angle * ((float)(i - 1) / (num_points - 2));
                vec3 p = vec3_add(cc, vec3_scale(vec3_rotate_about_axis(dir0, gizmo->rotate.axis_rotation, t), cr));
                points[i] = _world_to_screen(p);
            }
            vec4 col = V4(1, 1, 1, 0.4f);
            _add_convex_poly(draw_list, points, num_points, col);
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->rotate.axis = hovered_axis;
                gizmo->rotate.axis_rotation = axis[hovered_axis];
                gizmo->rotate.start_point = circle_p[hovered_axis];
                gizmo->rotate.start_rotation = gizmo->transform.rotation;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec4 col = color[i];
            if ((!gizmo->is_active && i == hovered_axis) ||
                    (gizmo->is_active && i == gizmo->rotate.axis)) {
                col = V4(1, 1, 0, 1);
            }
            float thickness = 4;
            int n = 20;
            vec3 pt = circle_p0[i];
            for (int j = 0; j < n; j++) {
                float t0 = 0.5f * MF_PI * ((float) j / n);
                float t1 = 0.5f * MF_PI * ((float) (j + 1) / n);
                vec3 dir = vec3_sub(pt, cc);
                vec2 p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t0)));
                vec2 p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t1)));
                _add_line(draw_list, p0, p1, thickness, col); 

                p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t0)));
                p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t1)));
                _add_line(draw_list, p0, p1, thickness, col); 
            }
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_SCALE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->scale.axis;
            vec3 scale = vec3_sub(closest_point[axis_i], gizmo->scale.start_point);
            scale = vec3_snap(scale, gizmo->scale.snap);
            gizmo->transform.scale = vec3_add(gizmo->scale.start_scale, scale);
            gizmo->delta_transform.scale = scale;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->scale.axis = hovered_axis;
                gizmo->scale.start_point = closest_point[hovered_axis];
                gizmo->scale.start_scale = gizmo->transform.scale;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->scale.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float r = 7.5;
            _add_circle(draw_list, p1, r, col);
        }
    }
}